

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<double>::AnnotateSize
          (RepeatedField<double> *this,int old_size,int new_size)

{
  string *psVar1;
  char *pcStack_20;
  void *apvStack_18 [2];
  
  if ((old_size != new_size) &&
     ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    pcStack_20 = (char *)((this->soo_rep_).field_0.long_rep.elements_int & 0xfffffffffffffff8);
    apvStack_18[0] = (void *)0x0;
    psVar1 = absl::lts_20240722::log_internal::Check_NEImpl<char*,decltype(nullptr)>
                       (&pcStack_20,apvStack_18,"ret != nullptr");
    if (psVar1 == (string *)0x0) {
      return;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)apvStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x98,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)apvStack_18);
  }
  return;
}

Assistant:

void AnnotateSize(int old_size, int new_size) const {
    if (old_size != new_size) {
      ABSL_ATTRIBUTE_UNUSED const bool is_soo = this->is_soo();
      ABSL_ATTRIBUTE_UNUSED const Element* elem = unsafe_elements(is_soo);
      ABSL_ANNOTATE_CONTIGUOUS_CONTAINER(elem, elem + Capacity(is_soo),
                                         elem + old_size, elem + new_size);
      if (new_size < old_size) {
        ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(
            elem + new_size, (old_size - new_size) * sizeof(Element));
      }
    }
  }